

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  long lVar9;
  uint uVar10;
  ulong *puVar11;
  U32 UVar12;
  BYTE *pBVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  BYTE *pStart;
  ulong *puVar18;
  BYTE *pBVar19;
  BYTE *ip;
  int iVar20;
  ulong *puVar21;
  ulong *puVar22;
  long lVar23;
  seqDef *psVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  ulong *puVar28;
  uint uVar29;
  BYTE *pInLoopLimit;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  
  puVar4 = (ulong *)((long)src + srcSize);
  puVar21 = (ulong *)((long)src + (srcSize - 8));
  pBVar13 = (ms->window).base + (ms->window).dictLimit;
  uVar5 = rep[1];
  puVar18 = (ulong *)((ulong)(pBVar13 == (BYTE *)src) + (long)src);
  uVar25 = (int)puVar18 - (int)pBVar13;
  uVar34 = (ulong)uVar5;
  if (uVar25 < uVar5) {
    uVar34 = 0;
  }
  uVar32 = (uint)uVar34;
  uVar6 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar30 = (ulong)uVar6;
  if (uVar25 < uVar6) {
    uVar30 = 0;
  }
  uVar26 = (uint)uVar30;
  if (puVar21 <= puVar18) {
LAB_00167564:
    uVar29 = 0;
    if (uVar25 < uVar5) {
      uVar29 = uVar5;
    }
    if (uVar25 < uVar6) {
      uVar29 = uVar6;
    }
    if (uVar26 == 0) {
      uVar26 = uVar29;
    }
    if (uVar32 != 0) {
      uVar29 = uVar32;
    }
    *rep = uVar26;
    rep[1] = uVar29;
    return (long)puVar4 - (long)src;
  }
  puVar1 = (ulong *)((long)puVar4 - 7);
  puVar2 = (ulong *)((long)puVar4 - 3);
  puVar3 = (ulong *)((long)puVar4 - 1);
LAB_00166c27:
  uVar31 = uVar30;
  if (((int)uVar30 == 0) ||
     (*(int *)((long)puVar18 + 1) != *(int *)((long)((long)puVar18 + 1U) - uVar30))) {
    UVar12 = (U32)puVar18;
    if (cParams->searchLength - 6 < 2) {
      pUVar8 = ms->chainTable;
      uVar29 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar19 = (ms->window).base;
      uVar32 = (ms->window).lowLimit;
      uVar33 = UVar12 - (int)pBVar19;
      uVar26 = uVar33 - uVar29;
      if (uVar33 < uVar29) {
        uVar26 = 0;
      }
      uVar7 = cParams->searchLog;
      uVar10 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                          (BYTE *)(ulong)cParams->hashLog,UVar12);
      if (uVar32 < uVar10) {
        iVar20 = 1 << ((byte)uVar7 & 0x1f);
        uVar14 = 99999999;
        uVar27 = 3;
        do {
          puVar28 = (ulong *)(pBVar19 + uVar10);
          if (*(char *)(uVar27 + (long)puVar28) == *(char *)((long)puVar18 + uVar27)) {
            puVar11 = puVar18;
            if (puVar18 < puVar1) {
              if (*puVar28 == *puVar18) {
                lVar15 = (ulong)uVar10 + 8;
                lVar23 = 0;
                do {
                  puVar11 = (ulong *)((long)puVar18 + lVar23 + 8);
                  if (puVar1 <= puVar11) {
                    puVar28 = (ulong *)(pBVar19 + lVar23 + lVar15);
                    goto LAB_00166df4;
                  }
                  lVar9 = lVar23 + lVar15;
                  lVar23 = lVar23 + 8;
                } while (*(ulong *)(pBVar19 + lVar9) == *puVar11);
                uVar17 = *puVar11 ^ *(ulong *)(pBVar19 + lVar9);
                uVar16 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar23;
              }
              else {
                uVar17 = *puVar18 ^ *puVar28;
                uVar16 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                uVar16 = uVar16 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00166df4:
              if ((puVar11 < puVar2) && ((int)*puVar28 == (int)*puVar11)) {
                puVar11 = (ulong *)((long)puVar11 + 4);
                puVar28 = (ulong *)((long)puVar28 + 4);
              }
              if ((puVar11 < puVar3) && ((short)*puVar28 == (short)*puVar11)) {
                puVar11 = (ulong *)((long)puVar11 + 2);
                puVar28 = (ulong *)((long)puVar28 + 2);
              }
              if (puVar11 < puVar4) {
                puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar28 == (char)*puVar11));
              }
              uVar16 = (long)puVar11 - (long)puVar18;
            }
            if ((uVar27 < uVar16) &&
               (uVar14 = (ulong)((uVar33 + 2) - uVar10), uVar27 = uVar16,
               (ulong *)((long)puVar18 + uVar16) == puVar4)) goto LAB_0016721a;
          }
          uVar16 = uVar27;
          if ((uVar10 <= uVar26) ||
             ((uVar10 = pUVar8[uVar10 & uVar29 - 1], uVar10 <= uVar32 ||
              (iVar20 = iVar20 + -1, uVar27 = uVar16, iVar20 == 0)))) goto LAB_0016721a;
        } while( true );
      }
    }
    else if (cParams->searchLength == 5) {
      pUVar8 = ms->chainTable;
      uVar29 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar19 = (ms->window).base;
      uVar32 = (ms->window).lowLimit;
      uVar33 = UVar12 - (int)pBVar19;
      uVar26 = uVar33 - uVar29;
      if (uVar33 < uVar29) {
        uVar26 = 0;
      }
      uVar7 = cParams->searchLog;
      uVar10 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                          (BYTE *)(ulong)cParams->hashLog,UVar12);
      if (uVar32 < uVar10) {
        iVar20 = 1 << ((byte)uVar7 & 0x1f);
        uVar14 = 99999999;
        uVar27 = 3;
        do {
          puVar28 = (ulong *)(pBVar19 + uVar10);
          if (*(char *)(uVar27 + (long)puVar28) == *(char *)((long)puVar18 + uVar27)) {
            puVar11 = puVar18;
            if (puVar18 < puVar1) {
              if (*puVar28 == *puVar18) {
                lVar15 = (ulong)uVar10 + 8;
                lVar23 = 0;
                do {
                  puVar11 = (ulong *)((long)puVar18 + lVar23 + 8);
                  if (puVar1 <= puVar11) {
                    puVar28 = (ulong *)(pBVar19 + lVar23 + lVar15);
                    goto LAB_00166fbf;
                  }
                  lVar9 = lVar23 + lVar15;
                  lVar23 = lVar23 + 8;
                } while (*(ulong *)(pBVar19 + lVar9) == *puVar11);
                uVar17 = *puVar11 ^ *(ulong *)(pBVar19 + lVar9);
                uVar16 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar23;
              }
              else {
                uVar17 = *puVar18 ^ *puVar28;
                uVar16 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                uVar16 = uVar16 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00166fbf:
              if ((puVar11 < puVar2) && ((int)*puVar28 == (int)*puVar11)) {
                puVar11 = (ulong *)((long)puVar11 + 4);
                puVar28 = (ulong *)((long)puVar28 + 4);
              }
              if ((puVar11 < puVar3) && ((short)*puVar28 == (short)*puVar11)) {
                puVar11 = (ulong *)((long)puVar11 + 2);
                puVar28 = (ulong *)((long)puVar28 + 2);
              }
              if (puVar11 < puVar4) {
                puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar28 == (char)*puVar11));
              }
              uVar16 = (long)puVar11 - (long)puVar18;
            }
            if ((uVar27 < uVar16) &&
               (uVar14 = (ulong)((uVar33 + 2) - uVar10), uVar27 = uVar16,
               (ulong *)((long)puVar18 + uVar16) == puVar4)) goto LAB_0016721a;
          }
          uVar16 = uVar27;
          if ((uVar10 <= uVar26) ||
             ((uVar10 = pUVar8[uVar10 & uVar29 - 1], uVar10 <= uVar32 ||
              (iVar20 = iVar20 + -1, uVar27 = uVar16, iVar20 == 0)))) goto LAB_0016721a;
        } while( true );
      }
    }
    else {
      pUVar8 = ms->chainTable;
      uVar29 = 1 << ((byte)cParams->chainLog & 0x1f);
      pBVar19 = (ms->window).base;
      uVar32 = (ms->window).lowLimit;
      uVar33 = UVar12 - (int)pBVar19;
      uVar26 = uVar33 - uVar29;
      if (uVar33 < uVar29) {
        uVar26 = 0;
      }
      uVar7 = cParams->searchLog;
      uVar10 = ZSTD_insertAndFindFirstIndex_internal
                         (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                          (BYTE *)(ulong)cParams->hashLog,UVar12);
      if (uVar32 < uVar10) {
        iVar20 = 1 << ((byte)uVar7 & 0x1f);
        uVar14 = 99999999;
        uVar27 = 3;
        do {
          puVar28 = (ulong *)(pBVar19 + uVar10);
          if (*(char *)(uVar27 + (long)puVar28) == *(char *)((long)puVar18 + uVar27)) {
            puVar11 = puVar18;
            if (puVar18 < puVar1) {
              if (*puVar28 == *puVar18) {
                lVar15 = (ulong)uVar10 + 8;
                lVar23 = 0;
                do {
                  puVar11 = (ulong *)((long)puVar18 + lVar23 + 8);
                  if (puVar1 <= puVar11) {
                    puVar28 = (ulong *)(pBVar19 + lVar23 + lVar15);
                    goto LAB_00167189;
                  }
                  lVar9 = lVar23 + lVar15;
                  lVar23 = lVar23 + 8;
                } while (*(ulong *)(pBVar19 + lVar9) == *puVar11);
                uVar17 = *puVar11 ^ *(ulong *)(pBVar19 + lVar9);
                uVar16 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar23;
              }
              else {
                uVar17 = *puVar18 ^ *puVar28;
                uVar16 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                  }
                }
                uVar16 = uVar16 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00167189:
              if ((puVar11 < puVar2) && ((int)*puVar28 == (int)*puVar11)) {
                puVar11 = (ulong *)((long)puVar11 + 4);
                puVar28 = (ulong *)((long)puVar28 + 4);
              }
              if ((puVar11 < puVar3) && ((short)*puVar28 == (short)*puVar11)) {
                puVar11 = (ulong *)((long)puVar11 + 2);
                puVar28 = (ulong *)((long)puVar28 + 2);
              }
              if (puVar11 < puVar4) {
                puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar28 == (char)*puVar11));
              }
              uVar16 = (long)puVar11 - (long)puVar18;
            }
            if ((uVar27 < uVar16) &&
               (uVar14 = (ulong)((uVar33 + 2) - uVar10), uVar27 = uVar16,
               (ulong *)((long)puVar18 + uVar16) == puVar4)) goto LAB_0016721a;
          }
          uVar16 = uVar27;
          if ((uVar10 <= uVar26) ||
             ((uVar10 = pUVar8[uVar10 & uVar29 - 1], uVar10 <= uVar32 ||
              (iVar20 = iVar20 + -1, uVar27 = uVar16, iVar20 == 0)))) goto LAB_0016721a;
        } while( true );
      }
    }
    goto LAB_00167220;
  }
  lVar15 = -uVar30;
  puVar28 = (ulong *)((long)puVar18 + 5);
  puVar22 = (ulong *)((long)puVar18 + lVar15 + 5);
  puVar11 = puVar28;
  if (puVar28 < puVar1) {
    if (*puVar22 == *puVar28) {
      lVar23 = 0;
      do {
        puVar11 = (ulong *)((long)puVar18 + lVar23 + 0xd);
        if (puVar1 <= puVar11) {
          puVar22 = (ulong *)((long)puVar18 + lVar15 + lVar23 + 0xd);
          puVar11 = (ulong *)((long)puVar18 + lVar23 + 0xd);
          goto LAB_001672cb;
        }
        uVar30 = *(ulong *)((long)puVar18 + lVar23 + lVar15 + 0xd);
        uVar27 = *puVar11;
        lVar23 = lVar23 + 8;
      } while (uVar30 == uVar27);
      uVar27 = uVar27 ^ uVar30;
      uVar30 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
        }
      }
      uVar16 = (uVar30 >> 3 & 0x1fffffff) + lVar23;
    }
    else {
      uVar27 = *puVar28 ^ *puVar22;
      uVar30 = 0;
      if (uVar27 != 0) {
        for (; (uVar27 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
        }
      }
      uVar16 = uVar30 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_001672cb:
    if ((puVar11 < puVar2) && ((int)*puVar22 == (int)*puVar11)) {
      puVar11 = (ulong *)((long)puVar11 + 4);
      puVar22 = (ulong *)((long)puVar22 + 4);
    }
    if ((puVar11 < puVar3) && ((short)*puVar22 == (short)*puVar11)) {
      puVar11 = (ulong *)((long)puVar11 + 2);
      puVar22 = (ulong *)((long)puVar22 + 2);
    }
    if (puVar11 < puVar4) {
      puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar22 == (char)*puVar11));
    }
    uVar16 = (long)puVar11 - (long)puVar28;
  }
  uVar16 = uVar16 + 4;
  UVar12 = 1;
  puVar18 = (ulong *)((long)puVar18 + 1U);
  goto LAB_0016731c;
LAB_0016721a:
  if (uVar16 < 4) {
LAB_00167220:
    puVar18 = (ulong *)((long)puVar18 + ((long)puVar18 - (long)src >> 8) + 1);
  }
  else {
    if (uVar14 == 0) {
      UVar12 = 1;
    }
    else {
      if ((src < puVar18) && (pBVar13 < (BYTE *)((long)puVar18 + (2 - uVar14)))) {
        puVar28 = puVar18;
        while (puVar18 = puVar28,
              *(char *)((long)puVar28 - 1) == *(char *)((long)puVar28 + (1 - uVar14))) {
          puVar18 = (ulong *)((long)puVar28 - 1);
          uVar16 = uVar16 + 1;
          if ((puVar18 <= src) ||
             (pBVar19 = (BYTE *)((long)puVar28 + (1 - uVar14)), puVar28 = puVar18,
             pBVar19 <= pBVar13)) break;
        }
      }
      UVar12 = (int)uVar14 + 1;
      uVar31 = (ulong)((int)uVar14 - 2);
      uVar34 = uVar30;
    }
LAB_0016731c:
    uVar30 = (long)puVar18 - (long)src;
    puVar11 = (ulong *)seqStore->lit;
    puVar28 = (ulong *)((long)puVar11 + uVar30);
    do {
      *puVar11 = *src;
      puVar11 = puVar11 + 1;
      src = (void *)((long)src + 8);
    } while (puVar11 < puVar28);
    seqStore->lit = seqStore->lit + uVar30;
    if (uVar30 < 0x10000) {
      psVar24 = seqStore->sequences;
    }
    else {
      seqStore->longLengthID = 1;
      psVar24 = seqStore->sequences;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar24->litLength = (U16)uVar30;
    psVar24->offset = UVar12;
    if (0xffff < uVar16 - 3) {
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar24->matchLength = (U16)(uVar16 - 3);
    seqStore->sequences = psVar24 + 1;
    puVar18 = (ulong *)((long)puVar18 + uVar16);
    src = puVar18;
    uVar30 = uVar31;
    if (((int)uVar34 != 0) && (puVar18 <= puVar21)) {
      while (uVar27 = uVar31, uVar31 = uVar34, src = puVar18, uVar30 = uVar27, uVar34 = uVar31,
            (int)*puVar18 == *(int *)((long)puVar18 - uVar31)) {
        lVar15 = -uVar31;
        puVar28 = (ulong *)((long)puVar18 + 4);
        puVar22 = (ulong *)((long)puVar18 + lVar15 + 4);
        puVar11 = puVar28;
        if (puVar28 < puVar1) {
          if (*puVar22 == *puVar28) {
            lVar23 = 0;
            do {
              puVar11 = (ulong *)((long)puVar18 + lVar23 + 0xc);
              if (puVar1 <= puVar11) {
                puVar22 = (ulong *)((long)puVar18 + lVar15 + lVar23 + 0xc);
                puVar11 = (ulong *)((long)puVar18 + lVar23 + 0xc);
                goto LAB_0016745c;
              }
              uVar34 = *(ulong *)((long)puVar18 + lVar23 + lVar15 + 0xc);
              uVar30 = *puVar11;
              lVar23 = lVar23 + 8;
            } while (uVar34 == uVar30);
            uVar30 = uVar30 ^ uVar34;
            uVar34 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
              }
            }
            uVar34 = (uVar34 >> 3 & 0x1fffffff) + lVar23;
          }
          else {
            uVar30 = *puVar28 ^ *puVar22;
            uVar34 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
              }
            }
            uVar34 = uVar34 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_0016745c:
          if ((puVar11 < puVar2) && ((int)*puVar22 == (int)*puVar11)) {
            puVar11 = (ulong *)((long)puVar11 + 4);
            puVar22 = (ulong *)((long)puVar22 + 4);
          }
          if ((puVar11 < puVar3) && ((short)*puVar22 == (short)*puVar11)) {
            puVar11 = (ulong *)((long)puVar11 + 2);
            puVar22 = (ulong *)((long)puVar22 + 2);
          }
          if (puVar11 < puVar4) {
            puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar22 == (char)*puVar11));
          }
          uVar34 = (long)puVar11 - (long)puVar28;
        }
        *(ulong *)seqStore->lit = *puVar18;
        psVar24 = seqStore->sequences;
        psVar24->litLength = 0;
        psVar24->offset = 1;
        if (0xffff < uVar34 + 1) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar24->matchLength = (U16)(uVar34 + 1);
        seqStore->sequences = psVar24 + 1;
        puVar18 = (ulong *)((long)puVar18 + uVar34 + 4);
        src = puVar18;
        uVar30 = uVar31;
        uVar34 = uVar27;
        if (((int)uVar27 == 0) || (puVar21 < puVar18)) break;
      }
    }
  }
  uVar32 = (uint)uVar34;
  uVar26 = (uint)uVar30;
  if (puVar21 <= puVar18) goto LAB_00167564;
  goto LAB_00166c27;
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 0);
}